

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

void __thiscall
QOpenGL2PaintEngineExPrivate::composite
          (QOpenGL2PaintEngineExPrivate *this,QOpenGLRect *boundingRect)

{
  setCoords(this->staticVertexCoordinateArray,boundingRect);
  uploadData(this,0,this->staticVertexCoordinateArray,8);
  (**(code **)(*(long *)&this->funcs + 0x78))(6,0,4);
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::composite(const QOpenGLRect& boundingRect)
{
    setCoords(staticVertexCoordinateArray, boundingRect);

    uploadData(QT_VERTEX_COORDS_ATTR, staticVertexCoordinateArray, 8);
    funcs.glDrawArrays(GL_TRIANGLE_FAN, 0, 4);
}